

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitBlock(ParseNodeBlock *pnodeBlock,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
              BOOL fReturnValue)

{
  OpCode OVar1;
  ParseNode *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  FuncInfo *funcInfo_00;
  ParseNode *pPVar6;
  
  if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x39c,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this = pnodeBlock->pnodeStmt;
  if (this != (ParseNode *)0x0) {
    BeginEmitBlock(pnodeBlock,byteCodeGenerator,funcInfo);
    pPVar6 = pnodeBlock->pnodeLastValStmt;
    OVar1 = this->nop;
    while (OVar1 == knopList) {
      pPVar5 = ParseNode::AsParseNodeBin(this);
      if (pPVar5->pnode1 == pPVar6) {
        pPVar6 = (ParseNode *)0x0;
      }
      ByteCodeGenerator::EmitTopLevelStatement
                (byteCodeGenerator,pPVar5->pnode1,funcInfo,
                 (uint)(pPVar6 == (ParseNode *)0x0 && fReturnValue != 0));
      pPVar5 = ParseNode::AsParseNodeBin(this);
      this = pPVar5->pnode2;
      OVar1 = this->nop;
    }
    ByteCodeGenerator::EmitTopLevelStatement
              (byteCodeGenerator,this,funcInfo,
               (uint)((pPVar6 == (ParseNode *)0x0 || this == pPVar6) && fReturnValue != 0));
    EndEmitBlock(pnodeBlock,byteCodeGenerator,funcInfo_00);
    return;
  }
  return;
}

Assistant:

void EmitBlock(ParseNodeBlock *pnodeBlock, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, BOOL fReturnValue)
{
    Assert(pnodeBlock->nop == knopBlock);
    ParseNode *pnode = pnodeBlock->pnodeStmt;
    if (pnode == nullptr)
    {
        return;
    }

    BeginEmitBlock(pnodeBlock, byteCodeGenerator, funcInfo);

    ParseNode *pnodeLastValStmt = pnodeBlock->pnodeLastValStmt;

    while (pnode->nop == knopList)
    {
        ParseNode* stmt = pnode->AsParseNodeBin()->pnode1;
        if (stmt == pnodeLastValStmt)
        {
            // This is the last guaranteed return value, so any potential return values have to be
            // copied to the return register from this point forward.
            pnodeLastValStmt = nullptr;
        }
        byteCodeGenerator->EmitTopLevelStatement(stmt, funcInfo, fReturnValue && (pnodeLastValStmt == nullptr));
        pnode = pnode->AsParseNodeBin()->pnode2;
    }

    if (pnode == pnodeLastValStmt)
    {
        pnodeLastValStmt = nullptr;
    }
    byteCodeGenerator->EmitTopLevelStatement(pnode, funcInfo, fReturnValue && (pnodeLastValStmt == nullptr));

    EndEmitBlock(pnodeBlock, byteCodeGenerator, funcInfo);
}